

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

ParsingResult * __thiscall
QLocaleData::validateChars
          (QLocaleData *this,QStringView str,NumberMode numMode,int decDigits,
          NumberOptions number_options)

{
  QStringView text;
  undefined1 uVar1;
  char cVar2;
  bool bVar3;
  ParsingResult *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  char last;
  bool scientific;
  anon_enum_32 state;
  char c;
  NumericTokenizer tokens;
  ParsingResult result;
  undefined4 in_stack_fffffffffffffc78;
  NumberMode in_stack_fffffffffffffc7c;
  undefined7 in_stack_fffffffffffffc80;
  byte in_stack_fffffffffffffc87;
  int in_stack_fffffffffffffc88;
  uint in_stack_fffffffffffffc8c;
  int in_stack_fffffffffffffc90;
  undefined2 in_stack_fffffffffffffc94;
  undefined1 in_stack_fffffffffffffc96;
  undefined1 in_stack_fffffffffffffc97;
  storage_type_conflict *psVar4;
  char local_32a;
  int local_328;
  int local_318;
  QFlagsStorageHelper<QLocale::NumberOption,_4> local_2fc;
  QFlagsStorageHelper<QLocale::NumberOption,_4> local_2f8;
  char local_2f1;
  NumericTokenizer *in_stack_fffffffffffffd10;
  NumberMode in_stack_fffffffffffffd2c;
  QLocaleData *in_stack_fffffffffffffd30;
  QStringView local_218;
  undefined1 *local_208;
  undefined1 *puStack_200;
  undefined1 *local_1f8;
  undefined1 *puStack_1f0;
  undefined1 *local_1e8;
  undefined1 *puStack_1e0;
  undefined1 *local_1d8;
  undefined1 *puStack_1d0;
  undefined1 *local_1c8;
  undefined1 *puStack_1c0;
  undefined1 *local_1b8;
  undefined1 *puStack_1b0;
  undefined1 *local_1a8;
  undefined1 *puStack_1a0;
  undefined1 *local_198;
  undefined1 *puStack_190;
  undefined1 *local_188;
  undefined1 *puStack_180;
  undefined1 *local_178;
  undefined1 *puStack_170;
  undefined1 *local_168;
  undefined1 *puStack_160;
  undefined1 *local_158;
  undefined1 *puStack_150;
  undefined1 *local_148;
  undefined1 *puStack_140;
  undefined1 *local_138;
  undefined4 local_128 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_128,0xaa,0x120);
  ParsingResult::ParsingResult((ParsingResult *)0x4d8e0e);
  QStringView::size(&local_218);
  QVarLengthArray<char,_256LL>::reserve
            ((QVarLengthArray<char,_256LL> *)
             CONCAT17(in_stack_fffffffffffffc97,
                      CONCAT16(in_stack_fffffffffffffc96,
                               CONCAT24(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90))),
             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  local_328 = 0;
  local_138 = &DAT_aaaaaaaaaaaaaaaa;
  psVar4 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  local_148 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
  local_158 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
  local_168 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_160 = &DAT_aaaaaaaaaaaaaaaa;
  local_178 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_170 = &DAT_aaaaaaaaaaaaaaaa;
  local_188 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_180 = &DAT_aaaaaaaaaaaaaaaa;
  local_198 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_190 = &DAT_aaaaaaaaaaaaaaaa;
  local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_1a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_1b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_1c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_1d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_1e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_1f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_208 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_200 = &DAT_aaaaaaaaaaaaaaaa;
  numericData(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
  text.m_size._4_2_ = in_stack_fffffffffffffc94;
  text.m_size._0_4_ = in_stack_fffffffffffffc90;
  text.m_size._6_1_ = in_stack_fffffffffffffc96;
  text.m_size._7_1_ = in_stack_fffffffffffffc97;
  text.m_data = psVar4;
  anon_unknown.dwarf_a5d2fc::NumericTokenizer::NumericTokenizer
            ((NumericTokenizer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),text,
             (NumericData *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
             in_stack_fffffffffffffc7c);
  NumericData::~NumericData
            ((NumericData *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  local_32a = '\0';
  local_318 = in_R9D;
  do {
    uVar1 = anon_unknown.dwarf_a5d2fc::NumericTokenizer::done
                      ((NumericTokenizer *)
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    if (((uVar1 ^ 0xff) & 1) == 0) {
      local_128[0] = 2;
      if ((((local_32a == ',') || (local_32a == '-')) || (local_32a == '+')) || (local_32a == 'e'))
      {
        local_128[0] = 1;
      }
      ParsingResult::ParsingResult
                ((ParsingResult *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (ParsingResult *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
LAB_004d92fe:
      anon_unknown.dwarf_a5d2fc::NumericTokenizer::~NumericTokenizer((NumericTokenizer *)0x4d930b);
      ParsingResult::~ParsingResult((ParsingResult *)0x4d9318);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return in_RDI;
    }
    cVar2 = anon_unknown.dwarf_a5d2fc::NumericTokenizer::nextToken(in_stack_fffffffffffffd10);
    local_2f1 = cVar2;
    bVar3 = QtMiscUtils::isAsciiDigit((int)cVar2);
    if (bVar3) {
      in_stack_fffffffffffffc90 = local_328;
      if (local_328 != 0) {
        if (local_328 == 1) {
          bVar3 = local_318 == 0;
          local_318 = local_318 + -1;
          if (bVar3) {
            in_RDI->state = Invalid;
            QVarLengthArray<char,_256LL>::QVarLengthArray(&in_RDI->buff);
            goto LAB_004d92fe;
          }
        }
        else if ((local_328 == 2) && (bVar3 = QtMiscUtils::isAsciiDigit((int)local_32a), !bVar3)) {
          in_stack_fffffffffffffc8c = in_stack_fffffffffffffc8c & 0xffffff;
          if (local_2f1 == '0') {
            local_2f8.super_QFlagsStorage<QLocale::NumberOption>.i =
                 (QFlagsStorage<QLocale::NumberOption>)
                 QFlags<QLocale::NumberOption>::operator&
                           ((QFlags<QLocale::NumberOption> *)
                            CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                            in_stack_fffffffffffffc7c);
            bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_2f8);
            in_stack_fffffffffffffc8c = CONCAT13(bVar3,(int3)in_stack_fffffffffffffc8c);
          }
          if ((char)(in_stack_fffffffffffffc8c >> 0x18) != '\0') {
            in_RDI->state = Invalid;
            QVarLengthArray<char,_256LL>::QVarLengthArray(&in_RDI->buff);
            goto LAB_004d92fe;
          }
        }
      }
    }
    else {
      in_stack_fffffffffffffc88 = (int)local_2f1;
      if (in_stack_fffffffffffffc88 == 0x2b) {
LAB_004d9156:
        if ((local_32a != '\0') && ((in_R8D != 2 || (local_32a != 'e')))) {
          in_RDI->state = Invalid;
          QVarLengthArray<char,_256LL>::QVarLengthArray(&in_RDI->buff);
          goto LAB_004d92fe;
        }
      }
      else if (in_stack_fffffffffffffc88 == 0x2c) {
        local_2fc.super_QFlagsStorage<QLocale::NumberOption>.i =
             (QFlagsStorage<QLocale::NumberOption>)
             QFlags<QLocale::NumberOption>::operator&
                       ((QFlags<QLocale::NumberOption> *)
                        CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                        in_stack_fffffffffffffc7c);
        bVar3 = ::QFlags::operator_cast_to_bool((QFlags *)&local_2fc);
        in_stack_fffffffffffffc87 = 1;
        if ((!bVar3) && (in_stack_fffffffffffffc87 = 1, local_328 == 0)) {
          bVar3 = QtMiscUtils::isAsciiDigit((int)local_32a);
          in_stack_fffffffffffffc87 = bVar3 ^ 0xff;
        }
        if ((in_stack_fffffffffffffc87 & 1) != 0) {
          in_RDI->state = Invalid;
          QVarLengthArray<char,_256LL>::QVarLengthArray(&in_RDI->buff);
          goto LAB_004d92fe;
        }
      }
      else {
        if (in_stack_fffffffffffffc88 == 0x2d) goto LAB_004d9156;
        if (in_stack_fffffffffffffc88 == 0x2e) {
          if ((in_R8D == 0) || (local_328 != 0)) {
            in_RDI->state = Invalid;
            QVarLengthArray<char,_256LL>::QVarLengthArray(&in_RDI->buff);
            goto LAB_004d92fe;
          }
          local_328 = 1;
        }
        else {
          if (in_stack_fffffffffffffc88 != 0x65) {
            in_RDI->state = Invalid;
            QVarLengthArray<char,_256LL>::QVarLengthArray(&in_RDI->buff);
            goto LAB_004d92fe;
          }
          if ((in_R8D != 2) || (local_328 == 2)) {
            in_RDI->state = Invalid;
            QVarLengthArray<char,_256LL>::QVarLengthArray(&in_RDI->buff);
            goto LAB_004d92fe;
          }
          local_328 = 2;
        }
      }
    }
    local_32a = local_2f1;
    if (local_2f1 != ',') {
      QVarLengthArray<char,_256LL>::append
                ((QVarLengthArray<char,_256LL> *)
                 CONCAT17(uVar1,CONCAT16(cVar2,CONCAT24(in_stack_fffffffffffffc94,
                                                        in_stack_fffffffffffffc90))),
                 (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    }
  } while( true );
}

Assistant:

ParsingResult
QLocaleData::validateChars(QStringView str, NumberMode numMode, int decDigits,
                           QLocale::NumberOptions number_options) const
{
    ParsingResult result;
    result.buff.reserve(str.size());

    enum { Whole, Fractional, Exponent } state = Whole;
    const bool scientific = numMode == DoubleScientificMode;
    NumericTokenizer tokens(str, numericData(numMode), numMode);
    char last = '\0';

    while (!tokens.done()) {
        char c = tokens.nextToken();

        if (isAsciiDigit(c)) {
            switch (state) {
            case Whole:
                // Nothing special to do (unless we want to check grouping sizes).
                break;
            case Fractional:
                // If a double has too many digits in its fractional part it is Invalid.
                if (decDigits-- == 0)
                    return {};
                break;
            case Exponent:
                if (!isAsciiDigit(last)) {
                    // This is the first digit in the exponent (there may have beena '+'
                    // or '-' in before). If it's a zero, the exponent is zero-padded.
                    if (c == '0' && (number_options & QLocale::RejectLeadingZeroInExponent))
                        return {};
                }
                break;
            }

        } else {
            switch (c) {
            case '.':
                // If an integer has a decimal point, it is Invalid.
                // A double can only have one, at the end of its whole-number part.
                if (numMode == IntegerMode || state != Whole)
                    return {};
                // Even when decDigits is 0, we do allow the decimal point to be
                // present - just as long as no digits follow it.

                state = Fractional;
                break;

            case '+':
            case '-':
                // A sign can only appear at the start or after the e of scientific:
                if (last != '\0' && !(scientific && last == 'e'))
                    return {};
                break;

            case ',':
                // Grouping is only allowed after a digit in the whole-number portion:
                if ((number_options & QLocale::RejectGroupSeparator) || state != Whole
                        || !isAsciiDigit(last)) {
                    return {};
                }
                // We could check grouping sizes are correct, but fixup()s are
                // probably better off correcting any misplacement instead.
                break;

            case 'e':
                // Only one e is allowed and only in scientific:
                if (!scientific || state == Exponent)
                    return {};
                state = Exponent;
                break;

            default:
                // Nothing else can validly appear in a number.
                // NumericTokenizer allows letters of "inf" and "nan", but
                // validators don't accept those values.
                // For anything else, tokens.nextToken() must have returned 0.
                Q_ASSERT(!c || c == 'a' || c == 'f' || c == 'i' || c == 'n');
                return {};
            }
        }

        last = c;
        if (c != ',') // Skip grouping
            result.buff.append(c);
    }

    result.state = ParsingResult::Acceptable;

    // Intermediate if it ends with any character that requires a digit after
    // it to be valid e.g. group separator, sign, or exponent
    if (last == ',' || last == '-' || last == '+' || last == 'e')
        result.state = ParsingResult::Intermediate;

    return result;
}